

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

int nni_getopt(nni_option *opts,char *nm,void *arg,void *buf,size_t *szp,nni_type otype)

{
  int iVar1;
  nni_type otype_local;
  size_t *szp_local;
  void *buf_local;
  void *arg_local;
  char *nm_local;
  nni_option *opts_local;
  
  nm_local = (char *)opts;
  while( true ) {
    if (*(long *)nm_local == 0) {
      return 9;
    }
    iVar1 = strcmp(*(char **)nm_local,nm);
    if (iVar1 == 0) break;
    nm_local = nm_local + 0x18;
  }
  if (*(long *)(nm_local + 8) == 0) {
    return 0x19;
  }
  iVar1 = (**(code **)(nm_local + 8))(arg,buf,szp,otype);
  return iVar1;
}

Assistant:

int
nni_getopt(const nni_option *opts, const char *nm, void *arg, void *buf,
    size_t *szp, nni_type otype)
{
	while (opts->o_name != NULL) {
		if (strcmp(opts->o_name, nm) == 0) {
			if (opts->o_get == NULL) {
				return (NNG_EWRITEONLY);
			}
			return (opts->o_get(arg, buf, szp, otype));
		}
		opts++;
	}
	return (NNG_ENOTSUP);
}